

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_data_converter_get_expected_output_frame_count
                    (ma_data_converter *pConverter,ma_uint64 inputFrameCount,
                    ma_uint64 *pOutputFrameCount)

{
  ma_uint64 *pOutputFrameCount_local;
  ma_uint64 inputFrameCount_local;
  ma_data_converter *pConverter_local;
  
  if (pOutputFrameCount == (ma_uint64 *)0x0) {
    pConverter_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pOutputFrameCount = 0;
    if (pConverter == (ma_data_converter *)0x0) {
      pConverter_local._4_4_ = MA_INVALID_ARGS;
    }
    else if (pConverter->hasResampler == '\0') {
      *pOutputFrameCount = inputFrameCount;
      pConverter_local._4_4_ = MA_SUCCESS;
    }
    else {
      pConverter_local._4_4_ =
           ma_resampler_get_expected_output_frame_count
                     (&pConverter->resampler,inputFrameCount,pOutputFrameCount);
    }
  }
  return pConverter_local._4_4_;
}

Assistant:

MA_API ma_result ma_data_converter_get_expected_output_frame_count(const ma_data_converter* pConverter, ma_uint64 inputFrameCount, ma_uint64* pOutputFrameCount)
{
    if (pOutputFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    *pOutputFrameCount = 0;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConverter->hasResampler) {
        return ma_resampler_get_expected_output_frame_count(&pConverter->resampler, inputFrameCount, pOutputFrameCount);
    } else {
        *pOutputFrameCount = inputFrameCount;   /* 1:1 */
        return MA_SUCCESS;
    }
}